

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

float ncnn::float16_to_float32(unsigned_short value)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  uint uVar4;
  int iVar5;
  
  uVar1 = (uint)(value >> 0xf);
  uVar4 = (value & 0x7c00) >> 10;
  if ((short)uVar4 == 0x1f) {
    fVar3 = (float)((uint)value << 0xd | uVar1 << 0x1f | 0x7f800000);
  }
  else {
    uVar2 = value & 0x3ff;
    if ((value & 0x7c00) == 0) {
      if ((short)uVar2 == 0) {
        fVar3 = (float)(uVar1 << 0x1f);
      }
      else {
        uVar4 = 0x38000000;
        if ((value & 0x200) == 0) {
          iVar5 = 0;
          do {
            iVar5 = iVar5 + 1;
            uVar4 = uVar2 >> 8;
            uVar2 = uVar2 * 2;
          } while ((uVar4 & 1) == 0);
          uVar4 = iVar5 * -0x800000 + 0x38000000;
        }
        fVar3 = (float)((uVar2 * 2 & 0x3fe) << 0xd | uVar1 << 0x1f | uVar4);
      }
    }
    else {
      fVar3 = (float)(uVar2 * 0x2000 + (uVar4 << 0x17 | uVar1 << 0x1f) + 0x38000000);
    }
  }
  return fVar3;
}

Assistant:

float float16_to_float32(unsigned short value)
{
    // 1 : 5 : 10
    unsigned short sign = (value & 0x8000) >> 15;
    unsigned short exponent = (value & 0x7c00) >> 10;
    unsigned short significand = value & 0x03FF;

    //     fprintf(stderr, "%d %d %d\n", sign, exponent, significand);

    // 1 : 8 : 23
    union
    {
        unsigned int u;
        float f;
    } tmp;
    if (exponent == 0)
    {
        if (significand == 0)
        {
            // zero
            tmp.u = (sign << 31);
        }
        else
        {
            // denormal
            exponent = 0;
            // find non-zero bit
            while ((significand & 0x200) == 0)
            {
                significand <<= 1;
                exponent++;
            }
            significand <<= 1;
            significand &= 0x3FF;
            tmp.u = (sign << 31) | ((-exponent + (-15 + 127)) << 23) | (significand << 13);
        }
    }
    else if (exponent == 0x1F)
    {
        // infinity or NaN
        tmp.u = (sign << 31) | (0xFF << 23) | (significand << 13);
    }
    else
    {
        // normalized
        tmp.u = (sign << 31) | ((exponent + (-15 + 127)) << 23) | (significand << 13);
    }

    return tmp.f;
}